

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O2

QString * QStringAlgorithms<const_QString>::trimmed_helper
                    (QString *__return_storage_ptr__,QString *str)

{
  QChar *pQVar1;
  QChar *unicode;
  TrimPositions TVar2;
  
  TVar2 = trimmed_helper_positions(str);
  unicode = TVar2.begin;
  pQVar1 = (QChar *)(str->d).ptr;
  if ((unicode == pQVar1) && (TVar2.end == pQVar1 + (str->d).size)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
  }
  else {
    QString::QString(__return_storage_ptr__,unicode,(long)TVar2.end - (long)unicode >> 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline StringType trimmed_helper(StringType &str)
    {
        const auto [begin, end] = trimmed_helper_positions(str);
        if (begin == str.cbegin() && end == str.cend())
            return str;
        if (!isConst && str.isDetached())
            return trimmed_helper_inplace(str, begin, end);
        return StringType(begin, end - begin);
    }